

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowest_lexicography.cpp
# Opt level: O3

int si9ma::cmp(void *param_1,void *param_2)

{
  uint uVar1;
  size_type __n;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_2);
  std::operator+(&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_1);
  __n = local_60._M_string_length;
  if (local_40._M_string_length < local_60._M_string_length) {
    __n = local_40._M_string_length;
  }
  if (__n != 0) {
    uVar1 = memcmp(local_60._M_dataplus._M_p,local_40._M_dataplus._M_p,__n);
    uVar2 = (ulong)uVar1;
    if (uVar1 != 0) goto LAB_0010da44;
  }
  uVar2 = 0xffffffff80000000;
  if (-0x80000000 < (long)(local_60._M_string_length - local_40._M_string_length)) {
    uVar2 = local_60._M_string_length - local_40._M_string_length;
  }
  if (0x7ffffffe < (long)uVar2) {
    uVar2 = 0;
  }
LAB_0010da44:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return (uint)(uVar2 >> 0x1f) & 1;
}

Assistant:

bool cmp(const string &str1,const string &str2){
        return str1 + str2 < str2 + str1;
    }